

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_13::NameApplier::BeginTryTableExpr(NameApplier *this,TryTableExpr *expr)

{
  pointer pTVar1;
  pointer pTVar2;
  CatchKind *pCVar3;
  Result RVar4;
  Var *in_RCX;
  Var *pVVar5;
  string_view sVar6;
  string_view name;
  
  pTVar1 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pTVar1 != pTVar2) {
    pVVar5 = &pTVar1->target;
    do {
      if (((*(CatchKind *)(pVVar5 + 1) & ~CatchRef) != CatchAll) &&
         (RVar4 = UseNameForTagVar((NameApplier *)this->module_,pVVar5 + -1), RVar4.enum_ == Error))
      {
        return (Result)Error;
      }
      sVar6 = FindLabelByVar((NameApplier *)
                             (this->labels_).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start,
                             (Var *)(this->labels_).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish);
      name._M_str = (char *)pVVar5;
      name._M_len = (size_t)sVar6._M_str;
      UseNameForVar((NameApplier *)sVar6._M_len,name,in_RCX);
      pCVar3 = (CatchKind *)(pVVar5 + 1);
      pVVar5 = (Var *)((long)(pVVar5 + 2) + 0x28);
    } while ((pointer)(pCVar3 + 2) != pTVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->block).label);
  return (Result)Ok;
}

Assistant:

Result NameApplier::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      CHECK_RESULT(UseNameForTagVar(&catch_.tag));
    }
    std::string_view label = FindLabelByVar(&catch_.target);
    UseNameForVar(label, &catch_.target);
  }
  PushLabel(expr->block.label);
  return Result::Ok;
}